

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void pinger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  pinger_t *pinger;
  undefined1 auVar2 [16];
  char *pcVar3;
  long lVar4;
  undefined8 uStack_40;
  
  pinger = (pinger_t *)stream->data;
  if (nread < 0) {
    if (nread == -0xfff) {
      puts("got EOF");
      free(buf->base);
      uv_close((uv_handle_t *)&(pinger->stream).tcp,pinger_on_close);
      return;
    }
    pcVar3 = "nread == UV_EOF";
    uStack_40 = 0x76;
LAB_0013c71c:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,uStack_40,pcVar3);
    abort();
  }
  lVar4 = 0;
  do {
    if (nread == lVar4) {
LAB_0013c6e2:
      free(buf->base);
      return;
    }
    if (buf->base[lVar4] != PING[pinger->state]) {
      pcVar3 = "buf->base[i] == PING[pinger->state]";
      uStack_40 = 0x82;
      goto LAB_0013c71c;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)pinger->state + 1;
    pinger->state = SUB164(auVar2 % ZEXT816(5),0);
    if (SUB168(auVar2 % ZEXT816(5),0) == 0) {
      printf("PONG %d\n",(ulong)(uint)pinger->pongs);
      iVar1 = pinger->pongs;
      pinger->pongs = iVar1 + 1;
      if (0x3e6 < iVar1) {
        uv_close((uv_handle_t *)&(pinger->stream).tcp,pinger_on_close);
        goto LAB_0013c6e2;
      }
      pinger_write_ping(pinger);
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static void pinger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  ssize_t i;
  pinger_t* pinger;

  pinger = (pinger_t*)stream->data;

  if (nread < 0) {
    ASSERT(nread == UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*)(&pinger->stream.tcp), pinger_on_close);

    return;
  }

  /* Now we count the pings */
  for (i = 0; i < nread; i++) {
    ASSERT(buf->base[i] == PING[pinger->state]);
    pinger->state = (pinger->state + 1) % (sizeof(PING) - 1);

    if (pinger->state != 0)
      continue;

    printf("PONG %d\n", pinger->pongs);
    pinger->pongs++;

    if (pinger->pongs < NUM_PINGS) {
      pinger_write_ping(pinger);
    } else {
      uv_close((uv_handle_t*)(&pinger->stream.tcp), pinger_on_close);
      break;
    }
  }

  free(buf->base);
}